

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void evaluate(char **argv)

{
  size_t sVar1;
  size_t local_7a0;
  size_t i;
  ifstream local_770 [8];
  ifstream params_file;
  undefined1 local_568 [8];
  Model model;
  CCELossNode *loss;
  MNIST *mnist;
  path local_4f8;
  path local_4d0;
  ifstream local_4a8 [8];
  ifstream labels;
  path local_290;
  path local_268;
  path local_240;
  ifstream local_218 [8];
  ifstream images;
  char **argv_local;
  
  printf("Executing evaluation routine\n");
  std::filesystem::__cxx11::path::path<char*,std::filesystem::__cxx11::path>
            (&local_268,argv,auto_format);
  std::filesystem::__cxx11::path::path<char[23],std::filesystem::__cxx11::path>
            (&local_290,(char (*) [23])"t10k-images-idx3-ubyte",auto_format);
  std::filesystem::__cxx11::operator/(&local_240,&local_268,&local_290);
  std::ifstream::ifstream<std::filesystem::__cxx11::path,std::filesystem::__cxx11::path>
            (local_218,&local_240,_S_bin);
  std::filesystem::__cxx11::path::~path(&local_240);
  std::filesystem::__cxx11::path::~path(&local_290);
  std::filesystem::__cxx11::path::~path(&local_268);
  std::filesystem::__cxx11::path::path<char*,std::filesystem::__cxx11::path>
            (&local_4f8,argv,auto_format);
  std::filesystem::__cxx11::path::path<char[23],std::filesystem::__cxx11::path>
            ((path *)&mnist,(char (*) [23])"t10k-labels-idx1-ubyte",auto_format);
  std::filesystem::__cxx11::operator/(&local_4d0,&local_4f8,(path *)&mnist);
  std::ifstream::ifstream<std::filesystem::__cxx11::path,std::filesystem::__cxx11::path>
            (local_4a8,&local_4d0,_S_bin);
  std::filesystem::__cxx11::path::~path(&local_4d0);
  std::filesystem::__cxx11::path::~path((path *)&mnist);
  std::filesystem::__cxx11::path::~path(&local_4f8);
  create_model((Model *)local_568,(ifstream *)local_218,(ifstream *)local_4a8,(MNIST **)&loss,
               (CCELossNode **)
               &model.nodes_.
                super__Vector_base<std::unique_ptr<Node,_std::default_delete<Node>_>,_std::allocator<std::unique_ptr<Node,_std::default_delete<Node>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::filesystem::__cxx11::path::path<char*,std::filesystem::__cxx11::path>
            ((path *)&i,argv + 1,auto_format);
  std::ifstream::ifstream<std::filesystem::__cxx11::path,std::filesystem::__cxx11::path>
            (local_770,(path *)&i,_S_bin);
  std::filesystem::__cxx11::path::~path((path *)&i);
  Model::load((Model *)local_568,(ifstream *)local_770);
  local_7a0 = 0;
  while( true ) {
    sVar1 = MNIST::size((MNIST *)loss);
    if (local_7a0 == sVar1) break;
    (*(loss->super_Node)._vptr_Node[3])(loss,0);
    local_7a0 = local_7a0 + 1;
  }
  (*(code *)((((model.nodes_.
                super__Vector_base<std::unique_ptr<Node,_std::default_delete<Node>_>,_std::allocator<std::unique_ptr<Node,_std::default_delete<Node>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_t).
              super___uniq_ptr_impl<Node,_std::default_delete<Node>_>._M_t.
              super__Tuple_impl<0UL,_Node_*,_std::default_delete<Node>_>.
              super__Head_base<0UL,_Node_*,_false>._M_head_impl)->antecedents_).
            super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage)();
  std::ifstream::~ifstream(local_770);
  Model::~Model((Model *)local_568);
  std::ifstream::~ifstream(local_4a8);
  std::ifstream::~ifstream(local_218);
  return;
}

Assistant:

void evaluate(char* argv[])
{
    std::printf("Executing evaluation routine\n");

    std::ifstream images{
        std::filesystem::path{argv[0]} / "t10k-images-idx3-ubyte",
        std::ios::binary};

    std::ifstream labels{
        std::filesystem::path{argv[0]} / "t10k-labels-idx1-ubyte",
        std::ios::binary};

    MNIST* mnist;
    CCELossNode* loss;
    // For the data to be loaded properly, the model must be constructed in the
    // same manner as it was constructed during training.
    Model model = create_model(images, labels, &mnist, &loss);

    // Instead of initializing the parameters randomly, here we load it from
    // disk (saved from a previous training run).
    std::ifstream params_file{std::filesystem::path{argv[1]}, std::ios::binary};
    model.load(params_file);

    // Evaluate all 10000 images in the test set and compute the loss average
    for (size_t i = 0; i != mnist->size(); ++i)
    {
        mnist->forward();
    }
    loss->print();
}